

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseUpdate_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *psVar1;
  allocator local_59;
  string local_58;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_58);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_58,"update_id",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->updateId);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"message",&local_59);
    psVar1 = &local_38;
    parseMessage_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                message);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"edited_message",&local_59);
    psVar1 = &local_38;
    parseMessage_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                editedMessage);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"channel_post",&local_59);
    psVar1 = &local_38;
    parseMessage_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                channelPost);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"edited_channel_post",&local_59);
    psVar1 = &local_38;
    parseMessage_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                editedChannelPost);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"inline_query",&local_59);
    psVar1 = &local_38;
    parseInlineQuery_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                inlineQuery);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"chosen_inline_result",&local_59);
    psVar1 = &local_38;
    parseChosenInlineResult_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                chosenInlineResult);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"callback_query",&local_59);
    psVar1 = &local_38;
    parseCallbackQuery_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                callbackQuery);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"shipping_query",&local_59);
    psVar1 = &local_38;
    parseShippingQuery_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                shippingQuery);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"pre_checkout_query",&local_59);
    psVar1 = &local_38;
    parsePreCheckoutQuery_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                preCheckoutQuery);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseUpdate(const Update::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "update_id", object->updateId);
    appendToJson(result, "message", parseMessage(object->message));
    appendToJson(result, "edited_message", parseMessage(object->editedMessage));
    appendToJson(result, "channel_post", parseMessage(object->channelPost));
    appendToJson(result, "edited_channel_post", parseMessage(object->editedChannelPost));
    appendToJson(result, "inline_query", parseInlineQuery(object->inlineQuery));
    appendToJson(result, "chosen_inline_result", parseChosenInlineResult(object->chosenInlineResult));
    appendToJson(result, "callback_query", parseCallbackQuery(object->callbackQuery));
    appendToJson(result, "shipping_query", parseShippingQuery(object->shippingQuery));
    appendToJson(result, "pre_checkout_query", parsePreCheckoutQuery(object->preCheckoutQuery));
    removeLastComma(result);
    result += '}';
    return result;
}